

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O0

void __thiscall GdlExpression::SetType(GdlExpression *this,ExpressionType exptResult)

{
  ExpressionType exptResult_local;
  GdlExpression *this_local;
  
  if ((this->m_exptResult != kexptBoolean) || (exptResult != kexptNumber)) {
    this->m_exptResult = exptResult;
  }
  return;
}

Assistant:

virtual void SetType(ExpressionType exptResult)
	{
		if (m_exptResult == kexptBoolean && exptResult == kexptNumber)
			return;

		Assert(
			exptResult == m_exptResult ||
			m_exptResult == kexptUnknown ||
			(m_exptResult == kexptNumber &&
				exptResult == kexptBoolean));

		m_exptResult = exptResult;
	}